

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_bind_syntax(sexp ls,sexp eval_ctx,sexp bind_ctx,int localp)

{
  int iVar1;
  sexp psVar2;
  sexp psVar3;
  char *message;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_58.var = &local_68;
  local_68 = (sexp)&DAT_0000043e;
  local_48.next = &local_58;
  local_48.var = &local_60;
  local_60 = (sexp)&DAT_0000043e;
  local_58.next = (eval_ctx->value).context.saves;
  (eval_ctx->value).context.saves = local_48.next;
  (eval_ctx->value).context.saves = &local_48;
LAB_0012d5af:
  if ((((ulong)ls & 3) != 0) || (ls->tag != 6)) {
    local_68 = (sexp)&DAT_0000043e;
LAB_0012d796:
    (eval_ctx->value).context.saves = local_58.next;
    return local_68;
  }
  psVar2 = (ls->value).type.name;
  if ((((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 6)) ||
      (psVar3 = (psVar2->value).type.cpl, ((ulong)psVar3 & 3) != 0)) || (psVar3->tag != 6)) {
LAB_0012d766:
    message = "bad syntax binding";
LAB_0012d78e:
    local_68 = sexp_compile_error(eval_ctx,message,psVar2);
    goto LAB_0012d796;
  }
  iVar1 = sexp_idp((psVar2->value).type.name);
  if ((iVar1 == 0) || ((psVar3->value).type.cpl != (sexp)0x23e)) goto LAB_0012d766;
  psVar2 = (psVar3->value).type.name;
  iVar1 = sexp_idp(psVar2);
  if (iVar1 == 0) {
    psVar2 = sexp_eval_op(eval_ctx,(sexp)0x0,2,psVar2,(sexp)0x0);
  }
  else {
    psVar2 = sexp_env_cell_loc(eval_ctx,(eval_ctx->value).type.cpl,psVar2,0,(sexp_conflict *)0x0);
    if (psVar2 == (sexp)0x0) {
      psVar2 = (sexp)&DAT_0000003e;
    }
    else {
      psVar2 = (psVar2->value).type.cpl;
    }
  }
  local_68 = psVar2;
  if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x14)) {
    psVar3 = (eval_ctx->value).type.cpl;
    local_68 = sexp_alloc_tagged_aux(eval_ctx,0x28,0x15);
    (local_68->value).type.cpl = psVar3;
    (local_68->value).type.name = psVar2;
    (local_68->value).bytecode.length = 0x3e;
  }
  if (((ulong)local_68 & 3) == 0) {
    if (local_68->tag == 0x15) {
LAB_0012d6cd:
      psVar2 = (ls->value).type.name;
      psVar3 = (psVar2->value).type.name;
      if (((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x16)) &&
         ((((bind_ctx->value).type.cpl)->value).type.name == (sexp)0x0)) {
        psVar3 = (psVar3->value).type.slots;
      }
      if (((((ulong)local_68 & 3) == 0) && (local_68->tag == 0x15)) &&
         ((psVar2 = (((psVar2->value).type.cpl)->value).type.name, ((ulong)psVar2 & 3) == 0 &&
          (psVar2->tag == 6)))) {
        (local_68->value).type.slots = (psVar2->value).type.slots;
      }
      if (localp == 0) {
        sexp_env_define(eval_ctx,(bind_ctx->value).type.cpl,psVar3,local_68);
      }
      else {
        local_60 = sexp_cons_op(eval_ctx,(sexp)0x0,2,psVar3,local_68);
        (local_60->value).type.slots = (((bind_ctx->value).type.cpl)->value).type.slots;
        (((bind_ctx->value).type.cpl)->value).type.slots = local_60;
      }
      ls = (ls->value).type.cpl;
      goto LAB_0012d5af;
    }
    if (((ulong)local_68 & 3) == 0) {
      if (local_68->tag == 0x19) goto LAB_0012d6cd;
      if ((((ulong)local_68 & 3) != 0) || (local_68->tag != 0x13)) goto LAB_0012d781;
      goto LAB_0012d796;
    }
  }
LAB_0012d781:
  message = "non-procedure macro";
  psVar2 = local_68;
  goto LAB_0012d78e;
}

Assistant:

static sexp analyze_bind_syntax (sexp ls, sexp eval_ctx, sexp bind_ctx, int localp) {
  sexp res = SEXP_VOID, name;
  sexp_gc_var2(mac, tmp);
  sexp_gc_preserve2(eval_ctx, mac, tmp);
  for ( ; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    if (! (sexp_pairp(sexp_car(ls)) && sexp_pairp(sexp_cdar(ls))
           && sexp_idp(sexp_caar(ls)) && sexp_nullp(sexp_cddar(ls)))) {
      res = sexp_compile_error(eval_ctx, "bad syntax binding", sexp_pairp(ls) ? sexp_car(ls) : ls);
      break;
    }
    if (sexp_idp(sexp_cadar(ls)))
      mac = sexp_env_ref(eval_ctx, sexp_context_env(eval_ctx), sexp_cadar(ls), SEXP_FALSE);
    else
      mac = sexp_eval(eval_ctx, sexp_cadar(ls), NULL);
    if (sexp_procedurep(mac))
      mac = sexp_make_macro(eval_ctx, mac, sexp_context_env(eval_ctx));
    if (!(sexp_macrop(mac)||sexp_corep(mac))) {
      res = (sexp_exceptionp(mac) ? mac
             : sexp_compile_error(eval_ctx, "non-procedure macro", mac));
      break;
    }
    name = sexp_caar(ls);
    if (sexp_synclop(name) && sexp_env_global_p(sexp_context_env(bind_ctx)))
      name = sexp_synclo_expr(name);
    if (sexp_macrop(mac) && sexp_pairp(sexp_cadar(ls)))
      sexp_macro_source(mac) = sexp_pair_source(sexp_cadar(ls));
    if (localp)
      sexp_env_push(eval_ctx, sexp_context_env(bind_ctx), tmp, name, mac);
    else
      sexp_env_define(eval_ctx, sexp_context_env(bind_ctx), name, mac);
#if !SEXP_USE_STRICT_TOPLEVEL_BINDINGS
    if (localp)
      sexp_env_cell_syntactic_p(sexp_env_cell(eval_ctx, sexp_context_env(bind_ctx), name, 0)) = 1;
#endif
  }
  sexp_gc_release2(eval_ctx);
  return res;
}